

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rank_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowPercentRankExecutor::EvaluateInternal
          (WindowPercentRankExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExecutorLocalState *this_00;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> _Var1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  long *plVar5;
  long *plVar6;
  reference pvVar7;
  long lVar8;
  pointer this_01;
  idx_t iVar9;
  idx_t i;
  idx_t iVar10;
  idx_t i_1;
  double dVar11;
  undefined1 auVar12 [16];
  
  pdVar2 = result->data;
  this_00 = lstate + 2;
  if (gstate[1].super_WindowExecutorState._vptr_WindowExecutorState == (_func_int **)0x0) {
    pvVar7 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,0);
    plVar5 = (long *)pvVar7->data;
    pvVar7 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,1);
    pdVar3 = pvVar7->data;
    pvVar7 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,2);
    plVar6 = (long *)pvVar7->data;
    lstate[0x12].range_cursor.
    super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl =
         (WindowCursor *)((*plVar6 - *plVar5) + 1);
    lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState =
         (_func_int **)(row_idx - *plVar6);
    for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
      WindowPeerLocalState::NextRank
                ((WindowPeerLocalState *)lstate,plVar5[iVar10],plVar6[iVar10],row_idx + iVar10);
      lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        (~plVar5[iVar10] + *(long *)(pdVar3 + iVar10 * 8));
      if (lVar8 < 1) {
        dVar11 = 0.0;
      }
      else {
        _Var1._M_head_impl =
             lstate[0x12].range_cursor.
             super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
             .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
        dVar11 = (((double)CONCAT44(0x45300000,(int)((ulong)_Var1._M_head_impl >> 0x20)) -
                  1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)_Var1._M_head_impl) - 4503599627370496.0) + -1.0
                 ) / (double)lVar8;
      }
      *(double *)(pdVar2 + iVar10 * 8) = dVar11;
    }
  }
  else {
    pvVar7 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,6);
    pdVar3 = pvVar7->data;
    pvVar7 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,7);
    pdVar4 = pvVar7->data;
    for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
      lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        (~*(ulong *)(pdVar3 + iVar10 * 8) + *(long *)(pdVar4 + iVar10 * 8));
      this_01 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                              *)(gstate + 1));
      iVar9 = WindowTokenTree::Rank
                        (this_01,*(idx_t *)(pdVar3 + iVar10 * 8),*(idx_t *)(pdVar4 + iVar10 * 8),
                         row_idx + iVar10);
      auVar12._8_4_ = (int)(iVar9 >> 0x20);
      auVar12._0_8_ = iVar9;
      auVar12._12_4_ = 0x45300000;
      if (lVar8 < 1) {
        dVar11 = 0.0;
      }
      else {
        dVar11 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)iVar9) - 4503599627370496.0) + -1.0) /
                 (double)lVar8;
      }
      *(double *)(pdVar2 + iVar10 * 8) = dVar11;
    }
  }
  return;
}

Assistant:

void WindowPercentRankExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                                 DataChunk &eval_chunk, Vector &result, idx_t count,
                                                 idx_t row_idx) const {
	auto &gpeer = gstate.Cast<WindowPeerGlobalState>();
	auto &lpeer = lstate.Cast<WindowPeerLocalState>();
	auto rdata = FlatVector::GetData<double>(result);

	if (gpeer.token_tree) {
		auto frame_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_BEGIN]);
		auto frame_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_END]);
		for (idx_t i = 0; i < count; ++i, ++row_idx) {
			auto denom = static_cast<double>(NumericCast<int64_t>(frame_end[i] - frame_begin[i] - 1));
			const auto rank = gpeer.token_tree->Rank(frame_begin[i], frame_end[i], row_idx);
			double percent_rank = denom > 0 ? ((double)rank - 1) / denom : 0;
			rdata[i] = percent_rank;
		}
		return;
	}

	//	Reset to "previous" row
	auto partition_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PARTITION_BEGIN]);
	auto partition_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PARTITION_END]);
	auto peer_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PEER_BEGIN]);
	lpeer.rank = (peer_begin[0] - partition_begin[0]) + 1;
	lpeer.rank_equal = (row_idx - peer_begin[0]);

	for (idx_t i = 0; i < count; ++i, ++row_idx) {
		lpeer.NextRank(partition_begin[i], peer_begin[i], row_idx);
		auto denom = static_cast<double>(NumericCast<int64_t>(partition_end[i] - partition_begin[i] - 1));
		double percent_rank = denom > 0 ? ((double)lpeer.rank - 1) / denom : 0;
		rdata[i] = percent_rank;
	}
}